

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferReferencedByShaderInterfaceBlockCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,bool extendedCases)

{
  Node *pNVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  ResourceTestCase *pRVar4;
  SharedPtrStateBase *pSVar5;
  undefined7 in_register_00000081;
  deInt32 *pdVar6;
  SharedPtr layout;
  SharedPtr arrayElement;
  SharedPtr variable;
  SharedPtr structMember;
  SharedPtr variableArray;
  SharedPtr variableStruct;
  SharedPtr local_a8;
  SharedPtr local_98;
  undefined1 local_88 [8];
  SharedPtrStateBase *pSStack_80;
  MatrixOrder local_78;
  Context *local_70;
  SharedPtr local_68;
  SharedPtr local_58;
  SharedPtr local_48;
  undefined4 local_38;
  NodeType local_34;
  
  local_38 = (undefined4)CONCAT71(in_register_00000081,extendedCases);
  pNVar2 = parentStructure->m_ptr;
  local_34 = pNVar2->m_type;
  local_70 = context;
  pNVar1 = (Node *)operator_new(0x28);
  pSVar5 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar2;
  (pNVar1->m_enclosingNode).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 1;
  local_88 = (undefined1  [8])pNVar1;
  pSStack_80 = (SharedPtrStateBase *)operator_new(0x20);
  pSStack_80->strongRefCount = 0;
  pSStack_80->weakRefCount = 0;
  pSStack_80->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSStack_80[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSStack_80->strongRefCount = 1;
  pSStack_80->weakRefCount = 1;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar2 = parentStructure->m_ptr;
  pSVar5 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = pNVar2;
  (pNVar1->m_enclosingNode).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
  local_a8.m_ptr = pNVar1;
  local_a8.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_a8.m_state)->strongRefCount = 0;
  (local_a8.m_state)->weakRefCount = 0;
  (local_a8.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  local_a8.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  (local_a8.m_state)->strongRefCount = 1;
  (local_a8.m_state)->weakRefCount = 1;
  pNVar1 = (Node *)operator_new(0x20);
  pNVar2 = parentStructure->m_ptr;
  pSVar5 = parentStructure->m_state;
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar1->m_type = TYPE_STRUCT_MEMBER;
  (pNVar1->m_enclosingNode).m_ptr = pNVar2;
  (pNVar1->m_enclosingNode).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
  local_98.m_ptr = pNVar1;
  local_98.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_98.m_state)->strongRefCount = 0;
  (local_98.m_state)->weakRefCount = 0;
  (local_98.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  local_98.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  (local_98.m_state)->strongRefCount = 1;
  (local_98.m_state)->weakRefCount = 1;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = local_a8.m_ptr;
  (pNVar2->m_enclosingNode).m_state = local_a8.m_state;
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
  local_68.m_ptr = pNVar2;
  local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_68.m_state)->strongRefCount = 0;
  (local_68.m_state)->weakRefCount = 0;
  (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  (local_68.m_state)->strongRefCount = 1;
  (local_68.m_state)->weakRefCount = 1;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = local_98.m_ptr;
  (pNVar2->m_enclosingNode).m_state = local_98.m_state;
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
  local_58.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_58.m_state = pSVar3;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar4,local_70,(SharedPtr *)local_88,queryTarget,"float");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_68,queryTarget,"float_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_58,queryTarget,"float_struct");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
  pSVar5 = local_58.m_state;
  pdVar6 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
  }
  LOCK();
  pdVar6 = &pSVar5->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar5 = local_68.m_state;
  if (local_68.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_68.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = local_98.m_state;
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_98.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = local_a8.m_state;
  if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &(local_a8.m_state)->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_a8.m_ptr = (Node *)0x0;
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar5 = pSStack_80;
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar6 = &pSStack_80->strongRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_88 = (undefined1  [8])0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_80->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_34 != TYPE_INTERFACE_BLOCK) {
    pNVar1 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_88,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar1[1]._vptr_Node = (_func_int **)local_88;
    *(SharedPtrStateBase **)&pNVar1[1].m_type = pSStack_80;
    *(MatrixOrder *)&pNVar1[1].m_enclosingNode.m_ptr = local_78;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar1;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_a8.m_state = pSVar5;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x28;
    pSStack_80 = (SharedPtrStateBase *)0x0;
    local_88 = (undefined1  [8])pNVar2;
    pSStack_80 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_80->strongRefCount = 0;
    pSStack_80->weakRefCount = 0;
    pSStack_80->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSStack_80[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_80->strongRefCount = 1;
    pSStack_80->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = local_a8.m_ptr;
    (pNVar2->m_enclosingNode).m_state = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = pNVar2;
    local_98.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_98.m_state)->strongRefCount = 0;
    (local_98.m_state)->weakRefCount = 0;
    (local_98.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_98.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    (local_98.m_state)->strongRefCount = 1;
    (local_98.m_state)->weakRefCount = 1;
    pNVar1 = (Node *)operator_new(0x20);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_STRUCT_MEMBER;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar1;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = local_98.m_ptr;
    (pNVar2->m_enclosingNode).m_state = local_98.m_state;
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_98.m_state)->strongRefCount = (local_98.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x28;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar2;
    local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_58.m_state)->strongRefCount = 0;
    (local_58.m_state)->weakRefCount = 0;
    (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_58.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    (local_58.m_state)->strongRefCount = 1;
    (local_58.m_state)->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = local_68.m_ptr;
    (pNVar2->m_enclosingNode).m_state = local_68.m_state;
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x28;
    local_48.m_state = (SharedPtrStateBase *)0x0;
    local_48.m_ptr = pNVar2;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    local_48.m_state = pSVar3;
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,(SharedPtr *)local_88,queryTarget,"sampler");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_58,queryTarget,"sampler_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_48,queryTarget,"sampler_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pSVar5 = local_48.m_state;
    pdVar6 = &pSVar3->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_48.m_ptr = (Node *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])(local_48.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_58.m_state;
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_58.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])(local_58.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = local_68.m_state;
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_68.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = local_98.m_state;
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_98.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98.m_ptr = (Node *)0x0;
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_80->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_88 = (undefined1  [8])0x0;
        (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar1 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)local_88,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar1[1]._vptr_Node = (_func_int **)local_88;
    *(SharedPtrStateBase **)&pNVar1[1].m_type = pSStack_80;
    *(MatrixOrder *)&pNVar1[1].m_enclosingNode.m_ptr = local_78;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar1;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_a8.m_state = pSVar5;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_VARIABLE;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0x54;
    pSStack_80 = (SharedPtrStateBase *)0x0;
    local_88 = (undefined1  [8])pNVar2;
    pSStack_80 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_80->strongRefCount = 0;
    pSStack_80->weakRefCount = 0;
    pSStack_80->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSStack_80[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSStack_80->strongRefCount = 1;
    pSStack_80->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = local_a8.m_ptr;
    (pNVar2->m_enclosingNode).m_state = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_a8.m_state)->strongRefCount = (local_a8.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = pNVar2;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_98.m_state = pSVar5;
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_VARIABLE;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 0x54;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar1;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    local_68.m_state = pSVar3;
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar4,local_70,(SharedPtr *)local_88,queryTarget,"atomic_uint");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_68,queryTarget,"atomic_uint_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pSVar5 = local_68.m_state;
    pdVar6 = &pSVar3->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_68.m_ptr = (Node *)0x0;
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])(local_68.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_98.m_state;
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_98.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98.m_ptr = (Node *)0x0;
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_80->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_88 = (undefined1  [8])0x0;
        (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  if ((char)local_38 != '\0') {
    pNVar1 = (Node *)operator_new(0x20);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_STRUCT_MEMBER;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_80 = (SharedPtrStateBase *)0x0;
    local_88 = (undefined1  [8])pNVar1;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    pSStack_80 = pSVar5;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar2;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_a8.m_state = pSVar5;
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_VARIABLE;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 1;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = pNVar1;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    local_98.m_state = pSVar3;
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_98,queryTarget,"float_array_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pSVar5 = local_98.m_state;
    pdVar6 = &pSVar3->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_80->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_88 = (undefined1  [8])0x0;
        (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar1 = (Node *)operator_new(0x28);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
    pSStack_80 = (SharedPtrStateBase *)0x0;
    local_88 = (undefined1  [8])pNVar1;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    pSStack_80 = pSVar5;
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar2;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_a8.m_state = pSVar5;
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_VARIABLE;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 1;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = pNVar1;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    local_98.m_state = pSVar3;
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_98,queryTarget,"float_struct_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pSVar5 = local_98.m_state;
    pdVar6 = &pSVar3->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_80->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_88 = (undefined1  [8])0x0;
        (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar1 = (Node *)operator_new(0x28);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
    pSStack_80 = (SharedPtrStateBase *)0x0;
    local_88 = (undefined1  [8])pNVar1;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    pSStack_80 = pSVar5;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar2;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_a8.m_state = pSVar5;
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_VARIABLE;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 1;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = pNVar1;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    local_98.m_state = pSVar3;
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_98,queryTarget,"float_array_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pSVar5 = local_98.m_state;
    pdVar6 = &pSVar3->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_80->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_88 = (undefined1  [8])0x0;
        (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar1 = (Node *)operator_new(0x20);
    pNVar2 = parentStructure->m_ptr;
    pSVar5 = parentStructure->m_state;
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_STRUCT_MEMBER;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    if (pSVar5 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
    }
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_80 = (SharedPtrStateBase *)0x0;
    local_88 = (undefined1  [8])pNVar1;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    pSStack_80 = pSVar5;
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    local_a8.m_state = (SharedPtrStateBase *)0x0;
    local_a8.m_ptr = pNVar2;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_a8.m_state = pSVar5;
    pNVar1 = (Node *)operator_new(0x28);
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar1->m_type = TYPE_VARIABLE;
    (pNVar1->m_enclosingNode).m_ptr = pNVar2;
    (pNVar1->m_enclosingNode).m_state = pSVar5;
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
    pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar1[1]._vptr_Node = 1;
    local_98.m_state = (SharedPtrStateBase *)0x0;
    local_98.m_ptr = pNVar1;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    local_98.m_state = pSVar3;
    pRVar4 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar4,local_70,&local_98,queryTarget,"float_struct_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
    pSVar5 = local_98.m_state;
    pdVar6 = &pSVar3->strongRefCount;
    LOCK();
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if (*pdVar6 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
    }
    LOCK();
    pdVar6 = &pSVar5->weakRefCount;
    *pdVar6 = *pdVar6 + -1;
    UNLOCK();
    if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar5 = local_a8.m_state;
    if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &(local_a8.m_state)->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar5 = pSStack_80;
    if (pSStack_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar6 = &pSStack_80->strongRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_88 = (undefined1  [8])0x0;
        (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
    }
    if (queryTarget->interface == PROGRAMINTERFACE_BUFFER_VARIABLE) {
      pNVar1 = (Node *)operator_new(0x28);
      pNVar2 = parentStructure->m_ptr;
      pSVar5 = parentStructure->m_state;
      pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar1->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar1->m_enclosingNode).m_ptr = pNVar2;
      (pNVar1->m_enclosingNode).m_state = pSVar5;
      if (pSVar5 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + 1;
        UNLOCK();
      }
      pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
      *(undefined4 *)&pNVar1[1]._vptr_Node = 0xfffffffe;
      pSStack_80 = (SharedPtrStateBase *)0x0;
      local_88 = (undefined1  [8])pNVar1;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      pSStack_80 = pSVar5;
      pNVar2 = (Node *)operator_new(0x28);
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar2->m_type = TYPE_VARIABLE;
      (pNVar2->m_enclosingNode).m_ptr = pNVar1;
      (pNVar2->m_enclosingNode).m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
      *(undefined4 *)&pNVar2[1]._vptr_Node = 1;
      local_a8.m_state = (SharedPtrStateBase *)0x0;
      local_a8.m_ptr = pNVar2;
      pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar3->strongRefCount = 0;
      pSVar3->weakRefCount = 0;
      pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar3->strongRefCount = 1;
      pSVar3->weakRefCount = 1;
      local_a8.m_state = pSVar3;
      pRVar4 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar4,local_70,&local_a8,queryTarget,"float_unsized_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
      pSVar5 = local_a8.m_state;
      pdVar6 = &pSVar3->strongRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_a8.m_ptr = (Node *)0x0;
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      pNVar2 = (Node *)operator_new(0x20);
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar2->m_type = TYPE_STRUCT_MEMBER;
      (pNVar2->m_enclosingNode).m_ptr = (Node *)local_88;
      (pNVar2->m_enclosingNode).m_state = pSStack_80;
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSStack_80->strongRefCount = pSStack_80->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar6 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
        *pdVar6 = *pdVar6 + 1;
        UNLOCK();
      }
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
      local_a8.m_state = (SharedPtrStateBase *)0x0;
      local_a8.m_ptr = pNVar2;
      pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar5->strongRefCount = 0;
      pSVar5->weakRefCount = 0;
      pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar5->strongRefCount = 1;
      pSVar5->weakRefCount = 1;
      local_a8.m_state = pSVar5;
      pNVar1 = (Node *)operator_new(0x28);
      pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
      pNVar1->m_type = TYPE_VARIABLE;
      (pNVar1->m_enclosingNode).m_ptr = pNVar2;
      (pNVar1->m_enclosingNode).m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar6 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
      *pdVar6 = *pdVar6 + 1;
      UNLOCK();
      pNVar1->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
      *(undefined4 *)&pNVar1[1]._vptr_Node = 1;
      local_98.m_state = (SharedPtrStateBase *)0x0;
      local_98.m_ptr = pNVar1;
      pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar3->strongRefCount = 0;
      pSVar3->weakRefCount = 0;
      pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
      pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
      pSVar3->strongRefCount = 1;
      pSVar3->weakRefCount = 1;
      local_98.m_state = pSVar3;
      pRVar4 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar4,local_70,&local_98,queryTarget,"float_unsized_struct_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar4);
      pSVar5 = local_98.m_state;
      pdVar6 = &pSVar3->strongRefCount;
      LOCK();
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if (*pdVar6 == 0) {
        local_98.m_ptr = (Node *)0x0;
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])(local_98.m_state);
      }
      LOCK();
      pdVar6 = &pSVar5->weakRefCount;
      *pdVar6 = *pdVar6 + -1;
      UNLOCK();
      if ((*pdVar6 == 0) && (local_98.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      pSVar5 = local_a8.m_state;
      if (local_a8.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar6 = &(local_a8.m_state)->strongRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if (*pdVar6 == 0) {
          local_a8.m_ptr = (Node *)0x0;
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[2])(local_a8.m_state);
        }
        LOCK();
        pdVar6 = &pSVar5->weakRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if ((*pdVar6 == 0) && (local_a8.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_a8.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pSVar5 = pSStack_80;
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar6 = &pSStack_80->strongRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if (*pdVar6 == 0) {
          local_88 = (undefined1  [8])0x0;
          (*pSStack_80->_vptr_SharedPtrStateBase[2])(pSStack_80);
        }
        LOCK();
        pdVar6 = &pSVar5->weakRefCount;
        *pdVar6 = *pdVar6 + -1;
        UNLOCK();
        if ((*pdVar6 == 0) && (pSStack_80 != (SharedPtrStateBase *)0x0)) {
          (*pSStack_80->_vptr_SharedPtrStateBase[1])();
        }
      }
    }
  }
  return;
}

Assistant:

static void generateBufferReferencedByShaderInterfaceBlockCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, bool extendedCases)
{
	const bool isDefaultBlock = (parentStructure->getType() != ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	// .float
	// .float_array
	// .float_struct
	{
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(parentStructure, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "float"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "float_struct"));
	}

	// .sampler
	// .sampler_array
	// .sampler_struct
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_SAMPLER_2D));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "sampler"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "sampler_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "sampler_struct"));
	}

	// .atomic_uint
	// .atomic_uint_array
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_UINT_ATOMIC_COUNTER));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "atomic_uint"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "atomic_uint_array"));
	}

	if (extendedCases)
	{
		// .float_array_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_struct"));
		}

		// .float_struct_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayStructMember	(new ResourceDefinition::StructMember(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_array"));
		}

		// .float_array_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subArrayElement		(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subArrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_array"));
		}

		// .float_struct_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subStructMember		(new ResourceDefinition::StructMember(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_struct"));
		}

		if (queryTarget.interface == PROGRAMINTERFACE_BUFFER_VARIABLE)
		{
			const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

			// .float_unsized_array
			{
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_array"));
			}

			// .float_unsized_struct_array
			{
				const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(arrayElement));
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_struct_array"));
			}
		}
	}
}